

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_ConstIterators_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ConstIterators_Test<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  iterator it_00;
  bool bVar1;
  nonempty_iterator in_RDI;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  const_iterator it;
  HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffcc8;
  const_iterator *it_01;
  const_iterator *this_00;
  char *message;
  int line;
  char *file;
  Type type;
  AssertHelper *this_01;
  nonempty_iterator ppVar2;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd28;
  char *in_stack_fffffffffffffd30;
  char *in_stack_fffffffffffffd38;
  char *in_stack_fffffffffffffd40;
  AssertionResult *in_stack_fffffffffffffd48;
  AssertHelper *in_stack_fffffffffffffd50;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffd70;
  AssertionResult local_208;
  value_type *in_stack_fffffffffffffe08;
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe10;
  AssertionResult local_118;
  iterator *local_108;
  const_iterator *pcStack_100;
  char *pcStack_f0;
  undefined8 local_e8;
  char *pcStack_e0;
  undefined8 local_d8;
  AssertHelper *pAStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  value_type local_10;
  
  ppVar2 = in_RDI + 2;
  local_10 = HashtableTest<google::HashtableInterface_SparseHashMap<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject(in_stack_fffffffffffffcc8,0);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::begin(in_stack_fffffffffffffd70);
  type = (Type)((ulong)local_d8 >> 0x20);
  line = (int)((ulong)local_e8 >> 0x20);
  it_00.super_iterator.pos.row_begin._M_current._0_4_ = (int)local_e8;
  it_00.super_iterator.ht =
       (sparse_hashtable<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
        *)pcStack_f0;
  it_00.super_iterator.pos.row_begin._M_current._4_4_ = line;
  it_00.super_iterator.pos.row_end._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)pcStack_e0;
  it_00.super_iterator.pos.row_current._M_current._0_4_ = (int)local_d8;
  it_00.super_iterator.pos.row_current._M_current._4_4_ = type;
  it_00.super_iterator.pos.col_current = (nonempty_iterator)pAStack_d0;
  it_00.super_iterator.end.row_begin._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)local_c8;
  it_00.super_iterator.end.row_end._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)uStack_c0;
  it_00.super_iterator.end.row_current._M_current =
       (sparsegroup<std::pair<const_int,_int>,_(unsigned_short)48,_Alloc<std::pair<const_int,_int>,_unsigned_long,_18446744073709551615UL>_>
        *)ppVar2;
  it_00.super_iterator.end.col_current = in_RDI;
  it_00.parent_ = in_stack_fffffffffffffd28;
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::const_iterator::const_iterator(pcStack_100,it_00);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffd70);
  google::
  sparse_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable_const_iterator(&pcStack_100->super_const_iterator,local_108);
  google::
  sparse_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator!=(&pcStack_100->super_const_iterator,(const_iterator *)local_108);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)pcStack_100,(bool *)local_108,(type *)0xa9dbe7);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
  it_01 = (const_iterator *)local_108;
  this_00 = pcStack_100;
  message = pcStack_f0;
  file = pcStack_e0;
  this_01 = pAStack_d0;
  if (!bVar1) {
    testing::Message::Message((Message *)pAStack_d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               in_stack_fffffffffffffd30);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(pAStack_d0,type,pcStack_e0,line,pcStack_f0);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd50,(Message *)in_stack_fffffffffffffd48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)pcStack_100);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe08);
    testing::Message::~Message((Message *)0xa9dca8);
    it_01 = (const_iterator *)local_108;
    this_00 = pcStack_100;
    message = pcStack_f0;
    file = pcStack_e0;
    this_01 = pAStack_d0;
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa9dd3f);
  google::
  sparse_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator++(&this_00->super_const_iterator);
  google::
  BaseHashtableInterface<google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::end(in_stack_fffffffffffffd70);
  google::
  sparse_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable_const_iterator(&this_00->super_const_iterator,(iterator *)it_01);
  google::
  sparse_hashtable_const_iterator<std::pair<const_int,_int>,_int,_TransparentHasher,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SelectKey,_google::sparse_hash_map<int,_int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator==(&this_00->super_const_iterator,it_01);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)this_00,(bool *)it_01,(type *)0xa9ddae);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_208);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               in_stack_fffffffffffffd30);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper(this_01,type,file,line,message);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd50,(Message *)in_stack_fffffffffffffd48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_00);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd28);
    testing::Message::~Message((Message *)0xa9de78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa9df03);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ConstIterators) {
  this->ht_.insert(this->UniqueObject(1));
  typename TypeParam::const_iterator it = this->ht_.begin();
  EXPECT_TRUE(it != this->ht_.end());
  ++it;
  EXPECT_TRUE(it == this->ht_.end());
}